

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool $_0::convertToBool<QByteArray,char_const*>(QByteArray *source)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *local_38;
  char *local_30;
  QByteArray local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::toLower_helper(&local_28,source);
  if ((undefined1 *)local_28.d.size != (undefined1 *)0x0) {
    local_30 = "0";
    bVar1 = ::operator==(&local_28,&local_30);
    if (!bVar1) {
      local_38 = "false";
      bVar1 = ::operator==(&local_28,&local_38);
      bVar1 = !bVar1;
      goto LAB_0029755b;
    }
  }
  bVar1 = false;
LAB_0029755b:
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool convertToBool(const T &source)
    {
        T str = source.toLower();
        return !(str.isEmpty() || str == LiteralWrapper("0") || str == LiteralWrapper("false"));
    }